

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O2

Error * ot::commissioner::ReadHexStringFile
                  (Error *__return_storage_ptr__,ByteArray *aData,string *aFilename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  ByteArray *this;
  bool bVar3;
  Error *pEVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  _Alloc_hider this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  long lVar9;
  size_type sVar10;
  string hexString;
  ByteArray data;
  string local_98;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  ByteArray *local_60;
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_98.field_2._M_local_buf[0] = '\0';
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ReadFile((Error *)local_58,&local_98,aFilename);
  __it._M_current = local_58;
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)__it._M_current);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)(local_58 + 8));
  sVar6 = local_98._M_string_length;
  _Var5._M_p = local_98._M_dataplus._M_p;
  if (EVar2 != kNone) goto LAB_0021caf8;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_98._M_dataplus._M_p + local_98._M_string_length);
  this_00._M_p = local_98._M_dataplus._M_p;
  sVar10 = local_98._M_string_length;
  local_60 = aData;
  for (lVar9 = (long)local_98._M_string_length >> 2; paVar8 = paVar1,
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)this_00._M_p, 0 < lVar9; lVar9 = lVar9 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::__0>
                          *)this_00._M_p,__it);
    if (bVar3) goto LAB_0021ca64;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::__0>
                          *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(this_00._M_p + 1))->_M_local_buf,__it);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this_00._M_p + 1);
    if (bVar3) goto LAB_0021ca64;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::__0>
                          *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(this_00._M_p + 2))->_M_local_buf,__it);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this_00._M_p + 2);
    if (bVar3) goto LAB_0021ca64;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::__0>
                          *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(this_00._M_p + 3))->_M_local_buf,__it);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(this_00._M_p + 3);
    if (bVar3) goto LAB_0021ca64;
    this_00._M_p = this_00._M_p + 4;
    sVar10 = sVar10 - 4;
  }
  if (sVar10 == 1) {
LAB_0021ca53:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::__0>
                          *)this_00._M_p,__it);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)this_00._M_p;
    if (!bVar3) {
      paVar7 = paVar1;
    }
LAB_0021ca64:
    this_01 = paVar7;
    if (paVar7 != paVar1) {
      while (this_01 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(this_01->_M_local_buf + 1), _Var5._M_p = local_98._M_dataplus._M_p,
            sVar6 = local_98._M_string_length, paVar8 = paVar7, this_01 != paVar1) {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::$_0>
                ::operator()((_Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::__0>
                              *)this_01->_M_local_buf,__it);
        if (!bVar3) {
          paVar7->_M_local_buf[0] = this_01->_M_local_buf[0];
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar7->_M_local_buf + 1);
        }
      }
    }
  }
  else {
    if (sVar10 == 2) {
LAB_0021ca44:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::__0>
                            *)this_00._M_p,__it);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)this_00._M_p;
      if (!bVar3) {
        this_00._M_p = this_00._M_p + 1;
        goto LAB_0021ca53;
      }
      goto LAB_0021ca64;
    }
    if (sVar10 == 3) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_pred<ot::commissioner::ReadHexStringFile(std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::__cxx11::string_const&)::__0>
                            *)this_00._M_p,__it);
      if (!bVar3) {
        this_00._M_p = this_00._M_p + 1;
        goto LAB_0021ca44;
      }
      goto LAB_0021ca64;
    }
  }
  std::__cxx11::string::erase(&local_98,paVar8,_Var5._M_p + sVar6);
  utils::Hex((Error *)local_58,(ByteArray *)&local_78,&local_98);
  this = local_60;
  pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_58);
  EVar2 = pEVar4->mCode;
  std::__cxx11::string::~string((string *)(local_58 + 8));
  if (EVar2 == kNone) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
  }
LAB_0021caf8:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

Error ReadHexStringFile(ByteArray &aData, const std::string &aFilename)
{
    Error       error;
    std::string hexString;
    ByteArray   data;

    SuccessOrExit(error = ReadFile(hexString, aFilename));

    hexString.erase(std::remove_if(hexString.begin(), hexString.end(), [](int c) { return isspace(c); }),
                    hexString.end());
    SuccessOrExit(error = utils::Hex(data, hexString));

    aData = data;

exit:
    return error;
}